

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O2

int h264_cabac_se(bitstream *str,h264_cabac_context *cabac,h264_cabac_se_val *tab,int *ctxIdx,
                 uint32_t *val)

{
  int iVar1;
  int iVar2;
  long lVar3;
  h264_cabac_se_val *tab_00;
  h264_cabac_se_bit *phVar4;
  uint32_t *binVal;
  char *__ptr;
  long lVar5;
  int *piVar6;
  int *piVar7;
  h264_cabac_se_val *phVar8;
  size_t sStack_b0;
  int bidx [8];
  uint32_t bit [8];
  
  if (str->dir == VS_ENCODE) {
    for (piVar6 = &tab->bits[0].val; piVar6[-2] != 0; piVar6 = piVar6 + 0x16) {
      if (*(h264_cabac_se_val **)(piVar6 + -4) != (h264_cabac_se_val *)0x0) {
        iVar2 = in_tab(*(h264_cabac_se_val **)(piVar6 + -4),*val);
        if (iVar2 == 0) goto LAB_0010a55b;
LAB_0010a561:
        lVar3 = 0;
        piVar7 = piVar6;
        while (lVar3 < piVar6[-2]) {
          bit[0] = *piVar7;
          iVar2 = h264_cabac_decision(str,cabac,ctxIdx[((h264_cabac_se_bit *)(piVar7 + -1))->bidx],
                                      bit);
          lVar3 = lVar3 + 1;
          piVar7 = piVar7 + 2;
          if (iVar2 != 0) {
            return 1;
          }
        }
        tab_00 = *(h264_cabac_se_val **)(piVar6 + -4);
        if (tab_00 == (h264_cabac_se_val *)0x0) goto LAB_0010a5ee;
        goto LAB_0010a5c8;
      }
      if (*val == piVar6[-6]) goto LAB_0010a561;
LAB_0010a55b:
    }
    __ptr = "No binarization for a value\n";
LAB_0010a616:
    sStack_b0 = 0x1c;
LAB_0010a618:
    fwrite(__ptr,sStack_b0,1,_stderr);
LAB_0010a621:
    iVar2 = 1;
  }
  else {
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      bidx[lVar3] = -1;
    }
    phVar4 = tab->bits;
    lVar3 = 0;
    do {
      iVar2 = tab[lVar3].blen;
      if (iVar2 == 0) {
        __ptr = "No value for a binarization\n";
        goto LAB_0010a616;
      }
      phVar8 = tab + lVar3;
      binVal = bit;
      for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
        iVar2 = bidx[lVar5];
        if (iVar2 == -1) {
          iVar2 = phVar4[lVar5].bidx;
          bidx[lVar5] = iVar2;
          iVar1 = h264_cabac_decision(str,cabac,ctxIdx[iVar2],binVal);
          if (iVar1 != 0) goto LAB_0010a621;
        }
        if (iVar2 != phVar4[lVar5].bidx) {
          __ptr = "Inconsistent CABAC se table!\n";
          sStack_b0 = 0x1d;
          goto LAB_0010a618;
        }
        iVar2 = phVar8->blen;
        if (*binVal != phVar4[lVar5].val) break;
        binVal = binVal + 1;
      }
      lVar3 = lVar3 + 1;
      phVar4 = phVar4 + 0xb;
    } while (iVar2 != (int)lVar5);
    tab_00 = phVar8->subtab;
    if (tab_00 == (h264_cabac_se_val *)0x0) {
      *val = phVar8->val;
LAB_0010a5ee:
      iVar2 = 0;
    }
    else {
LAB_0010a5c8:
      iVar2 = h264_cabac_se(str,cabac,tab_00,ctxIdx,val);
    }
  }
  return iVar2;
}

Assistant:

int h264_cabac_se(struct bitstream *str, struct h264_cabac_context *cabac, const struct h264_cabac_se_val *tab, int *ctxIdx, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		int i, j;
		for (i = 0; tab[i].blen; i++) {
			if (tab[i].subtab ? in_tab(tab[i].subtab, *val) : *val == tab[i].val) {
				uint32_t bit;
				for (j = 0; j < tab[i].blen; j++) {
					bit = tab[i].bits[j].val;
					if (h264_cabac_decision(str, cabac, ctxIdx[tab[i].bits[j].bidx], &bit))
						return 1;
				}
				if (tab[i].subtab)
					return h264_cabac_se(str, cabac, tab[i].subtab, ctxIdx, val);
				else
					return 0;
			}
		}
		fprintf(stderr, "No binarization for a value\n");
		return 1;
	} else {
		int i, j;
		uint32_t bit[8];
		int bidx[8];
		for (i = 0; i < 8; i++)
			bidx[i] = -1;
		for (i = 0; tab[i].blen; i++) {
			for (j = 0; j < tab[i].blen; j++) {
				if (bidx[j] == -1) {
					bidx[j] = tab[i].bits[j].bidx;
					if (h264_cabac_decision(str, cabac, ctxIdx[bidx[j]], &bit[j]))
						return 1;
				}
				if (bidx[j] != tab[i].bits[j].bidx) {
					fprintf(stderr, "Inconsistent CABAC se table!\n");
					return 1;
				}
				if (bit[j] != tab[i].bits[j].val)
					break;
			}
			if (j == tab[i].blen) {
				if (tab[i].subtab) {
					return h264_cabac_se(str, cabac, tab[i].subtab, ctxIdx, val);
				} else {
					*val = tab[i].val;
					return 0;
				}
			}
		}
		fprintf(stderr, "No value for a binarization\n");
		return 1;
	}
}